

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

int32_t __thiscall
icu_63::RuleBasedCollator::internalNextSortKeyPart
          (RuleBasedCollator *this,UCharIterator *iter,uint32_t *state,uint8_t *dest,int32_t count,
          UErrorCode *errorCode)

{
  byte bVar1;
  CollationSettings *settings;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  UChar *s;
  Level local_264;
  FixedSortKeyByteSink sink;
  PartLevelCallback callback;
  UIterCollationIterator ci;
  
  iVar5 = 0;
  iVar6 = 0;
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  if ((count < 0 || (state == (uint32_t *)0x0 || iter == (UCharIterator *)0x0)) ||
     (dest == (uint8_t *)0x0 && 0 < count)) {
    *errorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return 0;
  }
  if (count == 0) {
    return 0;
  }
  sink.super_SortKeyByteSink.super_ByteSink._vptr_ByteSink =
       (_func_int **)&PTR__SortKeyByteSink_003b3ad8;
  sink.super_SortKeyByteSink.ignore_ = state[1];
  sink.super_SortKeyByteSink.appended_ = 0;
  sink.super_SortKeyByteSink.buffer_ = (char *)dest;
  sink.super_SortKeyByteSink.capacity_ = count;
  (*iter->move)(iter,0,UITER_START);
  local_264 = *state;
  if ((int)local_264 < 6) {
    settings = this->settings;
    bVar1 = (byte)settings->options;
    ci.super_CollationIterator.isNumeric = bVar1 >> 1 & 1;
    callback.super_LevelCallback._vptr_LevelCallback = (_func_int **)&PTR__LevelCallback_003b3b38;
    callback.sink = &sink.super_SortKeyByteSink;
    callback.level = PRIMARY_LEVEL;
    callback.levelCapacity =
         (sink.super_SortKeyByteSink.capacity_ + sink.super_SortKeyByteSink.ignore_) -
         sink.super_SortKeyByteSink.appended_;
    ci.iter = iter;
    if ((bVar1 & 1) == 0) {
      ci.super_CollationIterator.data = this->data;
      ci.super_CollationIterator.ceBuffer.buffer.ptr =
           ci.super_CollationIterator.ceBuffer.buffer.stackArray;
      ci.super_CollationIterator.trie = (ci.super_CollationIterator.data)->trie;
      ci.super_CollationIterator.ceBuffer.length = 0;
      ci.super_CollationIterator.ceBuffer.buffer.capacity = 0x28;
      ci.super_CollationIterator.ceBuffer.buffer.needToRelease = '\0';
      ci.super_CollationIterator.cesIndex = 0;
      ci.super_CollationIterator.skipped = (SkippedState *)0x0;
      ci.super_CollationIterator.numCpFwd = -1;
      ci.super_CollationIterator.super_UObject._vptr_UObject =
           (_func_int **)&PTR__UIterCollationIterator_003b3d50;
      CollationKeys::writeSortKeyUpToQuaternary
                (&ci.super_CollationIterator,(ci.super_CollationIterator.data)->compressibleBytes,
                 settings,&sink.super_SortKeyByteSink,local_264,&callback.super_LevelCallback,'\0',
                 errorCode);
      UIterCollationIterator::~UIterCollationIterator(&ci);
    }
    else {
      ci.super_CollationIterator.data = this->data;
      ci.super_CollationIterator.ceBuffer.buffer.ptr =
           ci.super_CollationIterator.ceBuffer.buffer.stackArray;
      ci.super_CollationIterator.trie = (ci.super_CollationIterator.data)->trie;
      ci.super_CollationIterator.ceBuffer.length = 0;
      ci.super_CollationIterator.ceBuffer.buffer.capacity = 0x28;
      ci.super_CollationIterator.ceBuffer.buffer.needToRelease = '\0';
      ci.super_CollationIterator.cesIndex = 0;
      ci.super_CollationIterator.skipped = (SkippedState *)0x0;
      ci.super_CollationIterator.numCpFwd = -1;
      ci.super_CollationIterator.super_UObject._vptr_UObject =
           (_func_int **)&PTR__FCDUIterCollationIterator_003b3cc0;
      CollationKeys::writeSortKeyUpToQuaternary
                (&ci.super_CollationIterator,(ci.super_CollationIterator.data)->compressibleBytes,
                 settings,&sink.super_SortKeyByteSink,local_264,&callback.super_LevelCallback,'\0',
                 errorCode);
      FCDUIterCollationIterator::~FCDUIterCollationIterator((FCDUIterCollationIterator *)&ci);
    }
    bVar2 = false;
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      if (count < sink.super_SortKeyByteSink.appended_) {
        *state = callback.level;
        state[1] = callback.levelCapacity;
        bVar2 = false;
        iVar6 = count;
      }
      else {
        bVar2 = true;
        if ((this->settings->options & 0xfffff000U) == 0xf000) {
          (*iter->move)(iter,0,UITER_START);
          local_264 = IDENTICAL_LEVEL;
        }
      }
    }
    else {
      iVar6 = 0;
    }
    CollationKeys::LevelCallback::~LevelCallback(&callback.super_LevelCallback);
    iVar5 = iVar6;
    if (!bVar2) goto LAB_00223a24;
  }
  if (local_264 == IDENTICAL_LEVEL) {
    uVar3 = (sink.super_SortKeyByteSink.capacity_ + sink.super_SortKeyByteSink.ignore_) -
            sink.super_SortKeyByteSink.appended_;
    ci.super_CollationIterator.super_UObject._vptr_UObject =
         (_func_int **)&PTR__UnicodeString_003c0258;
    ci.super_CollationIterator.trie = (UTrie2 *)CONCAT62(ci.super_CollationIterator.trie._2_6_,2);
    do {
      iVar4 = (*(code *)iter->next)(iter);
      if (iVar4 < 0) break;
      callback.super_LevelCallback._vptr_LevelCallback._0_2_ = (short)iVar4;
      UnicodeString::doAppend((UnicodeString *)&ci,(UChar *)&callback,0,1);
    } while (-1 < iVar4);
    if (((ulong)ci.super_CollationIterator.trie & 0x11) == 0) {
      if (((ulong)ci.super_CollationIterator.trie & 2) == 0) {
        s = (UChar *)CONCAT44(ci.super_CollationIterator.ceBuffer._4_4_,
                              ci.super_CollationIterator.ceBuffer.length);
      }
      else {
        s = (UChar *)((long)&ci.super_CollationIterator.trie + 2);
      }
    }
    else {
      s = (UChar *)0x0;
    }
    if ((short)ci.super_CollationIterator.trie < 0) {
      iVar4 = ci.super_CollationIterator.trie._4_4_;
    }
    else {
      iVar4 = (int)(short)ci.super_CollationIterator.trie >> 5;
    }
    writeIdenticalLevel(this,s,s + iVar4,&sink.super_SortKeyByteSink,errorCode);
    bVar2 = false;
    iVar6 = 0;
    if ((*errorCode < U_ILLEGAL_ARGUMENT_ERROR) &&
       (bVar2 = true, iVar6 = iVar5, count < sink.super_SortKeyByteSink.appended_)) {
      *state = 6;
      state[1] = uVar3;
      bVar2 = false;
      iVar6 = count;
    }
    UnicodeString::~UnicodeString((UnicodeString *)&ci);
    if (!bVar2) goto LAB_00223a24;
  }
  iVar6 = sink.super_SortKeyByteSink.appended_;
  state[0] = 7;
  state[1] = 0;
  if (sink.super_SortKeyByteSink.appended_ < count) {
    memset(dest + sink.super_SortKeyByteSink.appended_,0,
           (ulong)(uint)(~sink.super_SortKeyByteSink.appended_ + count) + 1);
  }
LAB_00223a24:
  SortKeyByteSink::~SortKeyByteSink(&sink.super_SortKeyByteSink);
  return iVar6;
}

Assistant:

int32_t
RuleBasedCollator::internalNextSortKeyPart(UCharIterator *iter, uint32_t state[2],
                                           uint8_t *dest, int32_t count, UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode)) { return 0; }
    if(iter == NULL || state == NULL || count < 0 || (count > 0 && dest == NULL)) {
        errorCode = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }
    if(count == 0) { return 0; }

    FixedSortKeyByteSink sink(reinterpret_cast<char *>(dest), count);
    sink.IgnoreBytes((int32_t)state[1]);
    iter->move(iter, 0, UITER_START);

    Collation::Level level = (Collation::Level)state[0];
    if(level <= Collation::QUATERNARY_LEVEL) {
        UBool numeric = settings->isNumeric();
        PartLevelCallback callback(sink);
        if(settings->dontCheckFCD()) {
            UIterCollationIterator ci(data, numeric, *iter);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        } else {
            FCDUIterCollationIterator ci(data, numeric, *iter, 0);
            CollationKeys::writeSortKeyUpToQuaternary(ci, data->compressibleBytes, *settings,
                                                      sink, level, callback, FALSE, errorCode);
        }
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)callback.getLevel();
            state[1] = (uint32_t)callback.getLevelCapacity();
            return count;
        }
        // All of the normal levels are done.
        if(settings->getStrength() == UCOL_IDENTICAL) {
            level = Collation::IDENTICAL_LEVEL;
            iter->move(iter, 0, UITER_START);
        }
        // else fall through to setting ZERO_LEVEL
    }

    if(level == Collation::IDENTICAL_LEVEL) {
        int32_t levelCapacity = sink.GetRemainingCapacity();
        UnicodeString s;
        for(;;) {
            UChar32 c = iter->next(iter);
            if(c < 0) { break; }
            s.append((UChar)c);
        }
        const UChar *sArray = s.getBuffer();
        writeIdenticalLevel(sArray, sArray + s.length(), sink, errorCode);
        if(U_FAILURE(errorCode)) { return 0; }
        if(sink.NumberOfBytesAppended() > count) {
            state[0] = (uint32_t)level;
            state[1] = (uint32_t)levelCapacity;
            return count;
        }
    }

    // ZERO_LEVEL: Fill the remainder of dest with 00 bytes.
    state[0] = (uint32_t)Collation::ZERO_LEVEL;
    state[1] = 0;
    int32_t length = sink.NumberOfBytesAppended();
    int32_t i = length;
    while(i < count) { dest[i++] = 0; }
    return length;
}